

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::UnlockedPoolAllocator::~UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  _List_node_base *p_Var1;
  ulong extraout_RAX;
  UnlockedPoolAllocatorPrivate *pUVar2;
  _List_node_base *p_Var3;
  UnlockedPoolAllocatorPrivate *local_28;
  _List_node_base *local_20;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_005ff4e8;
  clear(this);
  pUVar2 = this->d;
  p_Var3 = (pUVar2->payouts).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if ((p_Var3 == (_List_node_base *)&pUVar2->payouts) ||
     (~UnlockedPoolAllocator((UnlockedPoolAllocator *)&this->d), pUVar2 = local_28,
     p_Var3 = local_20, (extraout_RAX & 1) != 0)) {
    while (p_Var3 != (_List_node_base *)&pUVar2->payouts) {
      p_Var1 = p_Var3->_M_next;
      operator_delete(p_Var3,0x20);
      p_Var3 = p_Var1;
    }
    p_Var3 = (pUVar2->budgets).
             super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)&pUVar2->budgets) {
      p_Var1 = p_Var3->_M_next;
      operator_delete(p_Var3,0x20);
      p_Var3 = p_Var1;
    }
  }
  else {
    pUVar2 = (UnlockedPoolAllocatorPrivate *)0x0;
  }
  operator_delete(pUVar2,0x40);
  return;
}

Assistant:

UnlockedPoolAllocator::~UnlockedPoolAllocator()
{
    clear();

    if (!d->payouts.empty())
    {
        NCNN_LOGE("FATAL ERROR! unlocked pool allocator destroyed too early");
#if NCNN_STDIO
        std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
        for (; it != d->payouts.end(); ++it)
        {
            void* ptr = it->second;
            NCNN_LOGE("%p still in use", ptr);
        }
#endif
    }

    delete d;
}